

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::SetRootProperty
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  
  if ((((instance->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) !=
      TypeIds_GlobalObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x51e,"(VarIs<RootObjectBase>(instance))",
                                "Instance must be a root object!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  BVar3 = SetProperty_Internal<true>(this,instance,propertyId,value,flags,info);
  return BVar3;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetRootProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        AssertMsg(VarIs<RootObjectBase>(instance), "Instance must be a root object!");
        return SetProperty_Internal<true>(instance, propertyId, value, flags, info);
    }